

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O0

void writecode(uchar *block,aint length,unsigned_short loadaddr,bool header,FILE *fp)

{
  int local_24;
  aint i;
  FILE *fp_local;
  bool header_local;
  unsigned_short loadaddr_local;
  aint length_local;
  uchar *block_local;
  
  if (header) {
    writeheader('\x03',"loader",(unsigned_short)length,loadaddr,0,fp);
  }
  writeword(length + 2,fp);
  parity = '\0';
  writebyte(0xff,fp);
  for (local_24 = 0; local_24 < length; local_24 = local_24 + 1) {
    writebyte(block[local_24],fp);
  }
  writebyte(parity,fp);
  return;
}

Assistant:

static void writecode(unsigned char* block, aint length, unsigned short loadaddr, bool header, FILE *fp) {
	if (header) {
		/* Filetype (3: Code) */
		writeheader(3, "loader", length, loadaddr, 0, fp);
	}

	/* Now onto the data bit */
	writeword(length + 2, fp);	/* Length of next block */
	parity = 0;
	writebyte(255, fp); /* Data... */
	for (aint i = 0; i < length; i++) {
		writebyte(block[i], fp);
	}
	writebyte(parity, fp);
}